

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::readent(entity *e,char *buf,int ver)

{
  int iVar1;
  int yaw;
  int ver_local;
  char *buf_local;
  entity *e_local;
  
  if ((ver < 0x1f) && ((e->type - 0x14 < 2 || (e->type - 0x19 < 6)))) {
    e->attr1 = (short)((e->attr1 + 0xb4) % 0x168);
  }
  if ((ver < 0x20) && (e->type - 0x1a < 4)) {
    iVar1 = ((int)e->attr1 % 0x168 + 0x168) % 0x168 + 7;
    e->attr1 = (short)iVar1 - (short)(iVar1 % 0xf);
  }
  return;
}

Assistant:

void readent(entity &e, char *buf, int ver) //read from disk, and init
    {
        if(ver <= 30) switch(e.type)
        {
            case FLAG:
            case MONSTER:
            case TELEDEST:
            case RESPAWNPOINT:
            case BOX:
            case BARREL:
            case PLATFORM:
            case ELEVATOR:
                e.attr1 = (int(e.attr1)+180)%360;
                break;
        }
        if(ver <= 31) switch(e.type)
        {
            case BOX:
            case BARREL:
            case PLATFORM:
            case ELEVATOR:
                int yaw = (int(e.attr1)%360 + 360)%360 + 7;
                e.attr1 = yaw - yaw%15;
                break;
        }
    }